

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

Vec_Wec_t * Gia_ManCollectTopmost(Gia_Man_t *p,Vec_Int_t *vFadds,Vec_Int_t *vMap,int nFaddMin)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Wec_t *p_01;
  Vec_Bit_t *p_02;
  Vec_Int_t *vVec1;
  Vec_Bit_t *vMarksTop;
  Vec_Wec_t *vChains;
  Vec_Int_t *vChain;
  int iFadd;
  int j;
  int i;
  int nFaddMin_local;
  Vec_Int_t *vMap_local;
  Vec_Int_t *vFadds_local;
  Gia_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  iVar1 = Vec_IntSize(vFadds);
  p_01 = Vec_WecAlloc(iVar1 / 5);
  iVar1 = Vec_IntSize(vFadds);
  p_02 = Vec_BitStart(iVar1 / 5);
  for (iFadd = 0; iVar1 = Vec_IntSize(vFadds), iFadd < iVar1 / 5; iFadd = iFadd + 1) {
    iVar1 = Vec_IntEntry(vFadds,iFadd * 5);
    iVar1 = Vec_IntEntry(vMap,iVar1);
    if (-1 < iVar1) {
      Vec_BitWriteEntry(p_02,iVar1,1);
    }
  }
  Gia_ManIncrementTravId(p);
  iFadd = 0;
  do {
    iVar1 = Vec_IntSize(vFadds);
    if (iVar1 / 5 <= iFadd) {
      Vec_BitFree(p_02);
      Vec_IntFree(p_00);
      return p_01;
    }
    iVar1 = Vec_BitEntry(p_02,iFadd);
    if (iVar1 == 0) {
      Gia_ManCollectOneChain(p,vFadds,iFadd,vMap,p_00);
      iVar1 = Vec_IntSize(p_00);
      if (nFaddMin <= iVar1) {
        vVec1 = Vec_WecPushLevel(p_01);
        Vec_IntAppend(vVec1,p_00);
        for (vChain._4_4_ = 0; iVar1 = Vec_IntSize(p_00), vChain._4_4_ < iVar1;
            vChain._4_4_ = vChain._4_4_ + 1) {
          iVar1 = Vec_IntEntry(p_00,vChain._4_4_);
          iVar2 = Vec_IntEntry(vFadds,iVar1 * 5 + 3);
          iVar2 = Gia_ObjIsTravIdCurrentId(p,iVar2);
          if (iVar2 != 0) {
            __assert_fail("!Gia_ObjIsTravIdCurrentId(p, Vec_IntEntry(vFadds, 5*iFadd+3))",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                          ,0x20b,
                          "Vec_Wec_t *Gia_ManCollectTopmost(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                         );
          }
          iVar2 = Vec_IntEntry(vFadds,iVar1 * 5 + 4);
          iVar2 = Gia_ObjIsTravIdCurrentId(p,iVar2);
          if (iVar2 != 0) {
            __assert_fail("!Gia_ObjIsTravIdCurrentId(p, Vec_IntEntry(vFadds, 5*iFadd+4))",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                          ,0x20c,
                          "Vec_Wec_t *Gia_ManCollectTopmost(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                         );
          }
          iVar2 = Vec_IntEntry(vFadds,iVar1 * 5 + 3);
          Gia_ManMarkWithTravId_rec(p,iVar2);
          iVar1 = Vec_IntEntry(vFadds,iVar1 * 5 + 4);
          Gia_ManMarkWithTravId_rec(p,iVar1);
        }
      }
    }
    iFadd = iFadd + 1;
  } while( true );
}

Assistant:

Vec_Wec_t * Gia_ManCollectTopmost( Gia_Man_t * p, Vec_Int_t * vFadds, Vec_Int_t * vMap, int nFaddMin )
{
    int i, j, iFadd;
    Vec_Int_t * vChain  = Vec_IntAlloc( 100 );
    Vec_Wec_t * vChains = Vec_WecAlloc( Vec_IntSize(vFadds)/5 );
    // erase elements appearing as FADD inputs
    Vec_Bit_t * vMarksTop = Vec_BitStart( Vec_IntSize(vFadds)/5 );
    Dtc_ForEachFadd( vFadds, i )
        if ( (iFadd = Vec_IntEntry(vMap, Vec_IntEntry(vFadds, 5*i+0))) >= 0 )
            Vec_BitWriteEntry( vMarksTop, iFadd, 1 );
    // compress the remaining ones
    Gia_ManIncrementTravId( p );
    Dtc_ForEachFadd( vFadds, i )
    {
        if ( Vec_BitEntry(vMarksTop, i) )
            continue;
        Gia_ManCollectOneChain( p, vFadds, i, vMap, vChain );
        if ( Vec_IntSize(vChain) < nFaddMin )
            continue;
        Vec_IntAppend( Vec_WecPushLevel(vChains), vChain );
        Vec_IntForEachEntry( vChain, iFadd, j )
        {
            assert( !Gia_ObjIsTravIdCurrentId(p, Vec_IntEntry(vFadds, 5*iFadd+3)) );
            assert( !Gia_ObjIsTravIdCurrentId(p, Vec_IntEntry(vFadds, 5*iFadd+4)) );
            Gia_ManMarkWithTravId_rec( p, Vec_IntEntry(vFadds, 5*iFadd+3) );
            Gia_ManMarkWithTravId_rec( p, Vec_IntEntry(vFadds, 5*iFadd+4) );
        }
    }
    // cleanup
    Vec_BitFree( vMarksTop );
    Vec_IntFree( vChain );
    return vChains;
}